

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize-packed.c++
# Opt level: O3

ssize_t __thiscall
capnp::_::PackedOutputStream::write(PackedOutputStream *this,int __fd,void *__buf,size_t __n)

{
  long lVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  long lVar8;
  int iVar9;
  undefined4 extraout_var;
  byte *pbVar10;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ulong uVar11;
  byte bVar12;
  long extraout_RDX;
  long extraout_RDX_00;
  byte *pbVar13;
  byte *pbVar14;
  undefined4 in_register_00000034;
  ulong uVar15;
  ulong uVar16;
  byte bVar17;
  byte *pbVar18;
  byte *pbVar19;
  byte *__src;
  undefined1 auVar20 [16];
  byte slowBuffer [20];
  long local_60;
  undefined1 local_48 [16];
  undefined4 local_38;
  
  iVar9 = (*(this->inner->super_OutputStream)._vptr_OutputStream[4])();
  pbVar14 = (byte *)CONCAT44(extraout_var,iVar9);
  local_48 = (undefined1  [16])0x0;
  local_38 = 0;
  pbVar18 = pbVar14;
  if (0 < (long)__buf) {
    pbVar19 = (byte *)((long)__buf + (long)CONCAT44(in_register_00000034,__fd));
    pbVar10 = (byte *)CONCAT44(in_register_00000034,__fd);
    local_60 = extraout_RDX;
    do {
      pbVar13 = pbVar14;
      if ((long)(pbVar18 + (local_60 - (long)pbVar14)) < 10) {
        (*(this->inner->super_OutputStream)._vptr_OutputStream[2])
                  (this->inner,pbVar18,(long)pbVar14 - (long)pbVar18);
        local_60 = 0x14;
        pbVar13 = local_48;
        pbVar18 = pbVar13;
      }
      bVar17 = *pbVar10;
      uVar11 = (ulong)(bVar17 != 0);
      pbVar13[1] = bVar17;
      lVar1 = uVar11 + 1;
      bVar12 = pbVar10[1];
      uVar15 = (ulong)(bVar12 != 0);
      pbVar13[uVar11 + 1] = bVar12;
      lVar8 = uVar15 + lVar1;
      bVar2 = pbVar10[2];
      uVar11 = (ulong)(bVar2 != 0);
      pbVar13[uVar15 + lVar1] = bVar2;
      lVar1 = uVar11 + lVar8;
      bVar3 = pbVar10[3];
      uVar15 = (ulong)(bVar3 != 0);
      pbVar13[uVar11 + lVar8] = bVar3;
      lVar8 = uVar15 + lVar1;
      bVar4 = pbVar10[4];
      uVar16 = (ulong)(bVar4 != 0);
      pbVar13[uVar15 + lVar1] = bVar4;
      lVar1 = uVar16 + lVar8;
      bVar5 = pbVar10[5];
      uVar11 = (ulong)(bVar5 != 0);
      pbVar13[uVar16 + lVar8] = bVar5;
      lVar8 = uVar11 + lVar1;
      bVar6 = pbVar10[6];
      uVar15 = (ulong)(bVar6 != 0);
      pbVar13[uVar11 + lVar1] = bVar6;
      bVar7 = pbVar10[7];
      pbVar13[uVar15 + lVar8] = bVar7;
      pbVar14 = pbVar13 + (bVar7 != 0) + uVar15 + lVar8;
      __src = pbVar10 + 8;
      bVar17 = (bVar7 != 0) << 7 | (bVar6 != 0) << 6 |
               (bVar5 != 0) << 5 |
               (bVar4 != 0) << 4 |
               (bVar3 != 0) << 3 | (bVar2 != 0) << 2 | bVar17 != 0 | (bVar12 != 0) * '\x02';
      *pbVar13 = bVar17;
      if (bVar17 == 0xff) {
        pbVar10 = pbVar10 + 0x800;
        if ((ulong)((long)pbVar19 - (long)__src) < 0x7f9) {
          pbVar10 = pbVar19;
        }
        uVar11 = 0;
        bVar17 = 0;
        do {
          bVar12 = bVar17;
          uVar15 = uVar11;
          pbVar13 = __src + uVar15;
          if (pbVar10 <= pbVar13) break;
          lVar1 = *(long *)pbVar13;
          auVar20[0] = -((char)lVar1 == '\0');
          auVar20[1] = -((char)((ulong)lVar1 >> 8) == '\0');
          auVar20[2] = -((char)((ulong)lVar1 >> 0x10) == '\0');
          auVar20[3] = -((char)((ulong)lVar1 >> 0x18) == '\0');
          auVar20[4] = -((char)((ulong)lVar1 >> 0x20) == '\0');
          auVar20[5] = -((char)((ulong)lVar1 >> 0x28) == '\0');
          auVar20[6] = -((char)((ulong)lVar1 >> 0x30) == '\0');
          auVar20[7] = -((char)((ulong)lVar1 >> 0x38) == '\0');
          auVar20[8] = 0xff;
          auVar20[9] = 0xff;
          auVar20[10] = 0xff;
          auVar20[0xb] = 0xff;
          auVar20[0xc] = 0xff;
          auVar20[0xd] = 0xff;
          auVar20[0xe] = 0xff;
          auVar20[0xf] = 0xff;
          bVar2 = SUB161(auVar20 >> 7,0) & 1 | (SUB161(auVar20 >> 0xf,0) & 1) << 1 |
                  (SUB161(auVar20 >> 0x17,0) & 1) << 2 | (SUB161(auVar20 >> 0x1f,0) & 1) << 3 |
                  (SUB161(auVar20 >> 0x27,0) & 1) << 4 | (SUB161(auVar20 >> 0x2f,0) & 1) << 5 |
                  (SUB161(auVar20 >> 0x37,0) & 1) << 6 | SUB161(auVar20 >> 0x3f,0) << 7;
          uVar11 = uVar15 + 8;
          bVar17 = bVar12 + 1;
        } while ((bVar2 & bVar2 - 1) == 0);
        uVar11 = uVar15 & 0xffffffff;
        *pbVar14 = bVar12;
        pbVar14 = pbVar14 + 1;
        if ((long)(pbVar18 + (local_60 - (long)pbVar14)) < (long)uVar11) {
          (*(this->inner->super_OutputStream)._vptr_OutputStream[2])
                    (this->inner,pbVar18,(long)pbVar14 - (long)pbVar18);
          (*(this->inner->super_OutputStream)._vptr_OutputStream[2])(this->inner,__src,uVar15);
          iVar9 = (*(this->inner->super_OutputStream)._vptr_OutputStream[4])();
          pbVar14 = (byte *)CONCAT44(extraout_var_00,iVar9);
          pbVar18 = pbVar14;
          __src = pbVar13;
          local_60 = extraout_RDX_00;
        }
        else {
          memcpy(pbVar14,__src,uVar11);
          pbVar14 = pbVar14 + uVar11;
          __src = pbVar13;
        }
      }
      else if (bVar17 == 0) {
        pbVar13 = __src;
        pbVar10 = pbVar10 + 0x800;
        if ((long)pbVar19 - (long)__src < 0x7f9) {
          pbVar10 = pbVar19;
        }
        for (; (pbVar13 < pbVar10 && (*(long *)pbVar13 == 0)); pbVar13 = pbVar13 + 8) {
        }
        *pbVar14 = (byte)((uint)((int)pbVar13 - (int)__src) >> 3);
        pbVar14 = pbVar14 + 1;
        __src = pbVar13;
      }
      pbVar10 = __src;
    } while (__src < pbVar19);
  }
  iVar9 = (*(this->inner->super_OutputStream)._vptr_OutputStream[2])
                    (this->inner,pbVar18,(long)pbVar14 - (long)pbVar18);
  return CONCAT44(extraout_var_01,iVar9);
}

Assistant:

void PackedOutputStream::write(kj::ArrayPtr<const byte> src) {
  kj::ArrayPtr<byte> buffer = inner.getWriteBuffer();
  byte slowBuffer[20]{};

  uint8_t* __restrict__ out = reinterpret_cast<uint8_t*>(buffer.begin());

  const uint8_t* __restrict__ in = src.begin();
  const uint8_t* const inEnd = src.end();

  while (in < inEnd) {
    if (reinterpret_cast<uint8_t*>(buffer.end()) - out < 10) {
      // Oops, we're out of space.  We need at least 10 bytes for the fast path, since we don't
      // bounds-check on every byte.

      // Write what we have so far.
      inner.write(buffer.first(out - reinterpret_cast<uint8_t*>(buffer.begin())));

      // Use a slow buffer into which we'll encode 10 to 20 bytes.  This should get us past the
      // output stream's buffer boundary.
      buffer = kj::arrayPtr(slowBuffer, sizeof(slowBuffer));
      out = reinterpret_cast<uint8_t*>(buffer.begin());
    }

    uint8_t* tagPos = out++;

#define HANDLE_BYTE(n) \
    uint8_t bit##n = *in != 0; \
    *out = *in; \
    out += bit##n; /* out only advances if the byte was non-zero */ \
    ++in

    HANDLE_BYTE(0);
    HANDLE_BYTE(1);
    HANDLE_BYTE(2);
    HANDLE_BYTE(3);
    HANDLE_BYTE(4);
    HANDLE_BYTE(5);
    HANDLE_BYTE(6);
    HANDLE_BYTE(7);
#undef HANDLE_BYTE

    uint8_t tag = (bit0 << 0) | (bit1 << 1) | (bit2 << 2) | (bit3 << 3)
                | (bit4 << 4) | (bit5 << 5) | (bit6 << 6) | (bit7 << 7);
    *tagPos = tag;

    if (tag == 0) {
      // An all-zero word is followed by a count of consecutive zero words (not including the
      // first one).

      // We can check a whole word at a time. (Here is where we use the assumption that
      // `src` is word-aligned.)
      const uint64_t* inWord = reinterpret_cast<const uint64_t*>(in);

      // The count must fit it 1 byte, so limit to 255 words.
      const uint64_t* limit = reinterpret_cast<const uint64_t*>(inEnd);
      if (limit - inWord > 255) {
        limit = inWord + 255;
      }

      while (inWord < limit && *inWord == 0) {
        ++inWord;
      }

      // Write the count.
      *out++ = inWord - reinterpret_cast<const uint64_t*>(in);

      // Advance input.
      in = reinterpret_cast<const uint8_t*>(inWord);

    } else if (tag == 0xffu) {
      // An all-nonzero word is followed by a count of consecutive uncompressed words, followed
      // by the uncompressed words themselves.

      // Count the number of consecutive words in the input which have no more than a single
      // zero-byte.  We look for at least two zeros because that's the point where our compression
      // scheme becomes a net win.
      // TODO(perf):  Maybe look for three zeros?  Compressing a two-zero word is a loss if the
      //   following word has no zeros.
      const uint8_t* runStart = in;

      const uint8_t* limit = inEnd;
      if ((size_t)(limit - in) > 255 * sizeof(word)) {
        limit = in + 255 * sizeof(word);
      }

      while (in < limit) {
        // Check eight input bytes for zeros.
        uint c = *in++ == 0;
        c += *in++ == 0;
        c += *in++ == 0;
        c += *in++ == 0;
        c += *in++ == 0;
        c += *in++ == 0;
        c += *in++ == 0;
        c += *in++ == 0;

        if (c >= 2) {
          // Un-read the word with multiple zeros, since we'll want to compress that one.
          in -= 8;
          break;
        }
      }

      // Write the count.
      uint count = in - runStart;
      *out++ = count / sizeof(word);

      if (count <= reinterpret_cast<uint8_t*>(buffer.end()) - out) {
        // There's enough space to memcpy.
        memcpy(out, runStart, count);
        out += count;
      } else {
        // Input overruns the output buffer.  We'll give it to the output stream in one chunk
        // and let it decide what to do.
        inner.write(buffer.first(reinterpret_cast<byte*>(out) - buffer.begin()));
        inner.write(kj::arrayPtr(runStart, in - runStart));
        buffer = inner.getWriteBuffer();
        out = reinterpret_cast<uint8_t*>(buffer.begin());
      }
    }
  }

  // Write whatever is left.
  inner.write(buffer.first(reinterpret_cast<byte*>(out) - buffer.begin()));
}